

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Raytracer::Image::Save(Image *this,string *name)

{
  ostream *poVar1;
  long lVar2;
  int x;
  long lVar3;
  int y;
  long lVar4;
  ofstream file;
  
  std::ofstream::ofstream(&file);
  std::ofstream::open((string *)&file,(_Ios_Openmode)name);
  poVar1 = std::operator<<((ostream *)&file,"P6\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::operator<<(poVar1,"\n255\n");
  for (lVar4 = 0; lVar4 < this->height; lVar4 = lVar4 + 1) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < this->width; lVar3 = lVar3 + 1) {
      std::operator<<((ostream *)&file,(char)(int)*(float *)((long)&this->datas[lVar4]->r + lVar2));
      std::operator<<((ostream *)&file,(char)(int)*(float *)((long)&this->datas[lVar4]->g + lVar2));
      std::operator<<((ostream *)&file,(char)(int)*(float *)((long)&this->datas[lVar4]->b + lVar2));
      lVar2 = lVar2 + 0xc;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Raytracer::Image::Save(std::string name) {
    std::ofstream file;
    file.open(name, std::ofstream::out | std::ofstream::binary);
    file << "P6\n" << width << " " << height << "\n255\n";
    for(int y = 0;y<height;y++){
        for(int x = 0;x<width;x++){
              file << (char)datas[y][x].r;
              file << (char)datas[y][x].g;
              file << (char)datas[y][x].b;

        }
    }
    file.close();
}